

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

QString * __thiscall
QTextBrowserPrivate::findFile(QString *__return_storage_ptr__,QTextBrowserPrivate *this,QUrl *name)

{
  QString *pQVar1;
  int iVar2;
  long lVar3;
  Data *pDVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  char16_t *pcVar7;
  char cVar8;
  QArrayData *pQVar9;
  QString *pQVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QLatin1String QVar12;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QStringBuilder<QLatin1String,_QString> local_a8;
  QString local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  QArrayData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x0;
  uStack_50 = (char16_t *)0x0;
  local_48 = (QArrayData *)0x0;
  QUrl::scheme();
  if (&(local_a8.b.d.d)->super_QArrayData == (QArrayData *)0x3) {
    QVar11.m_data = (storage_type_conflict *)local_a8.a.m_data;
    QVar11.m_size = 3;
    QVar12.m_data = "qrc";
    QVar12.m_size = 3;
    cVar8 = QtPrivate::equalStrings(QVar11,QVar12);
  }
  else {
    cVar8 = '\0';
  }
  if ((QArrayData *)local_a8.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.a.m_size,2,0x10);
    }
  }
  if (cVar8 == '\0') {
    QUrl::scheme();
    pDVar4 = local_a8.b.d.d;
    if ((QArrayData *)local_a8.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a8.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a8.a.m_size,2,0x10);
      }
    }
    if (&pDVar4->super_QArrayData == (QArrayData *)0x0) {
      QUrl::path(&local_a8,name,0x7f00000);
    }
    else {
      QUrl::toLocalFile();
    }
    pQVar5 = local_48;
    pcVar7 = uStack_50;
    pDVar4 = local_a8.b.d.d;
    pQVar9 = (QArrayData *)local_a8.a.m_size;
    uStack_50._4_4_ = local_a8.a.m_data._4_4_;
    local_a8.a.m_size = (qsizetype)local_58;
    uStack_50._0_4_ = SUB84(local_a8.a.m_data,0);
    local_a8.a.m_data = (char *)pcVar7;
    local_a8.b.d.d = (Data *)local_48;
    local_48 = &pDVar4->super_QArrayData;
    if (local_58 == (QArrayData *)0x0) goto LAB_004ad217;
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar2 = (local_58->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_a8.b.d.d = (Data *)pQVar5;
    pQVar5 = local_58;
  }
  else {
    QUrl::path(&local_c8,name,0x7f00000);
    local_a8.b.d.size = local_b8;
    local_a8.b.d.ptr = pcStack_c0;
    local_a8.b.d.d = (Data *)local_c8;
    local_a8.a.m_size = 2;
    local_a8.a.m_data = ":/";
    local_c8 = (QArrayData *)0x0;
    pcStack_c0 = (char16_t *)0x0;
    local_b8 = 0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>(&local_78,&local_a8);
    pcVar7 = uStack_50;
    pQVar9 = local_58;
    qVar6 = local_78.d.size;
    pDVar4 = local_78.d.d;
    local_78.d.d = (Data *)local_58;
    local_58 = &pDVar4->super_QArrayData;
    uStack_50._0_4_ = SUB84(local_78.d.ptr,0);
    uStack_50._4_4_ = local_78.d.ptr._4_4_;
    local_78.d.ptr = pcVar7;
    local_78.d.size = (qsizetype)local_48;
    local_48 = (QArrayData *)qVar6;
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
    if (&(local_a8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar9 = local_58;
    if (local_c8 == (QArrayData *)0x0) goto LAB_004ad217;
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar2 = (local_c8->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar5 = local_c8;
  }
  local_58 = pQVar9;
  pQVar9 = local_58;
  if (iVar2 == 0) {
    QArrayData::deallocate(pQVar5,2,0x10);
    pQVar9 = local_58;
  }
LAB_004ad217:
  local_58 = pQVar9;
  if (local_48 == (QArrayData *)0x0) {
    *(undefined4 *)&(__return_storage_ptr__->d).d = (undefined4)local_58;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_50;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_50._4_4_;
    pQVar9 = local_48;
  }
  else {
    QFileInfo::QFileInfo((QFileInfo *)&local_a8,(QString *)&local_58);
    cVar8 = QFileInfo::isRelative();
    QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
    if ((cVar8 != '\0') && (lVar3 = (this->searchPaths).d.size, lVar3 != 0)) {
      pQVar10 = (this->searchPaths).d.ptr;
      pQVar1 = pQVar10 + lVar3;
      do {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pDVar4 = (pQVar10->d).d;
        (__return_storage_ptr__->d).d = pDVar4;
        (__return_storage_ptr__->d).ptr = (pQVar10->d).ptr;
        (__return_storage_ptr__->d).size = (pQVar10->d).size;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cVar8 = QString::endsWith((QChar)(char16_t)__return_storage_ptr__,0x2f);
        if (cVar8 == '\0') {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        QString::append((QString *)__return_storage_ptr__);
        QFileInfo::QFileInfo((QFileInfo *)&local_a8,(QString *)__return_storage_ptr__);
        cVar8 = QFileInfo::isReadable();
        QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
        if (cVar8 != '\0') goto LAB_004ad36d;
        pDVar4 = (__return_storage_ptr__->d).d;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
          }
        }
        pQVar10 = pQVar10 + 1;
      } while (pQVar10 != pQVar1);
    }
    *(undefined4 *)&(__return_storage_ptr__->d).d = (undefined4)local_58;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_50;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_50._4_4_;
    pQVar9 = local_48;
  }
  uStack_50._4_4_ = 0;
  uStack_50._0_4_ = 0;
  local_58 = (QArrayData *)0x0;
  local_48 = (QArrayData *)0x0;
  (__return_storage_ptr__->d).size = (qsizetype)pQVar9;
LAB_004ad36d:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextBrowserPrivate::findFile(const QUrl &name) const
{
    QString fileName;
    if (name.scheme() == "qrc"_L1) {
        fileName = ":/"_L1 + name.path();
    } else if (name.scheme().isEmpty()) {
        fileName = name.path();
    } else {
#if defined(Q_OS_ANDROID)
        if (name.scheme() == "assets"_L1)
            fileName = "assets:"_L1 + name.path();
        else
#endif
            fileName = name.toLocalFile();
    }

    if (fileName.isEmpty())
        return fileName;

    if (QFileInfo(fileName).isAbsolute())
        return fileName;

    for (QString path : std::as_const(searchPaths)) {
        if (!path.endsWith(u'/'))
            path.append(u'/');
        path.append(fileName);
        if (QFileInfo(path).isReadable())
            return path;
    }

    return fileName;
}